

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

FlatFilePos __thiscall
node::BlockManager::FindNextBlockPos(BlockManager *this,uint nAddSize,uint nHeight,uint64_t nTime)

{
  vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *this_00;
  _Optional_base<node::BlockfileCursor,_true,_true> *p_Var1;
  uint *puVar2;
  uint uVar3;
  long lVar4;
  Notifications *pNVar5;
  _Storage<node::BlockfileCursor,_true> _Var6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  optional<node::BlockfileCursor> *poVar11;
  pointer pCVar12;
  size_t sVar13;
  long lVar14;
  _Storage<node::BlockfileCursor,_true> _Var15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  _Storage<node::BlockfileCursor,_true> _Var19;
  ulong uVar20;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  bool out_of_space;
  FlatFilePos local_a8;
  bool finalize_undo;
  int nFile;
  int last_blockfile;
  BlockfileType chain_type;
  uint nHeight_local;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  BlockfileCursor new_cursor;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  nHeight_local = nHeight;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock16,&this->cs_LastBlockFile,"cs_LastBlockFile",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
             ,0x342,false);
  bVar7 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value <= (int)nHeight &
          (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged;
  chain_type = (BlockfileType)bVar7;
  if ((this->m_blockfile_cursors)._M_elems[bVar7].
      super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
      super__Optional_payload_base<node::BlockfileCursor>._M_engaged == false) {
    if (chain_type == NORMAL) {
      __assert_fail("chain_type == BlockfileType::ASSUMED",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
                    ,0x348,
                    "FlatFilePos node::BlockManager::FindNextBlockPos(unsigned int, unsigned int, uint64_t)"
                   );
    }
    iVar10 = 0;
    iVar16 = 0;
    if ((this->m_blockfile_cursors)._M_elems[0].
        super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
      iVar16 = (this->m_blockfile_cursors)._M_elems[0].
               super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
               super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
    }
    if ((this->m_blockfile_cursors)._M_elems[1].
        super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
      iVar10 = (this->m_blockfile_cursors)._M_elems[1].
               super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
               super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
    }
    if (iVar10 < iVar16) {
      iVar10 = iVar16;
    }
    new_cursor.file_num = iVar10 + 1;
    new_cursor.undo_height = 0;
    _Var6._M_value.undo_height = 0;
    _Var6._M_value.file_num = new_cursor.file_num;
    (this->m_blockfile_cursors)._M_elems[bVar7].
    super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
    super__Optional_payload_base<node::BlockfileCursor>._M_engaged = true;
    (this->m_blockfile_cursors)._M_elems[bVar7].
    super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
    super__Optional_payload_base<node::BlockfileCursor>._M_payload = _Var6;
    bVar8 = ::LogAcceptCategory(BLOCKSTORAGE,Debug);
    if (bVar8) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file._M_len = 0x65;
      logging_function._M_str = "FindNextBlockPos";
      logging_function._M_len = 0x10;
      LogPrintFormatInternal<node::BlockfileType,node::BlockfileCursor>
                (logging_function,source_file,0x34b,BLOCKSTORAGE,Debug,
                 (ConstevalFormatString<2U>)0x68d48f,&chain_type,&new_cursor);
    }
  }
  nFile = (this->m_blockfile_cursors)._M_elems[chain_type].
          super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
  this_00 = &this->m_blockfile_info;
  last_blockfile = nFile;
  if ((int)(((long)(this->m_blockfile_info).
                   super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(this->m_blockfile_info).
                  super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x28) <= nFile) {
    std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::resize(this_00,(long)nFile + 1);
  }
  finalize_undo = false;
  uVar3 = nAddSize + 1;
  if (nAddSize < 0x10000) {
    uVar3 = 0x10000;
  }
  uVar18 = 0x8000000;
  if ((this->m_opts).fast_prune != false) {
    uVar18 = uVar3;
  }
  if (uVar18 <= nAddSize) {
    __assert_fail("nAddSize < max_blockfile_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
                  ,0x35f,
                  "FlatFilePos node::BlockManager::FindNextBlockPos(unsigned int, unsigned int, uint64_t)"
                 );
  }
  bVar8 = false;
  while( true ) {
    lVar14 = (long)nFile;
    pCVar12 = (this_00->super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>)._M_impl
              .super__Vector_impl_data._M_start;
    local_a8.nPos = pCVar12[lVar14].nSize;
    if (nAddSize + local_a8.nPos < uVar18) break;
    uVar3 = pCVar12[lVar14].nHeightLast;
    poVar11 = inline_assertion_check<true,std::optional<node::BlockfileCursor>&>
                        ((optional<node::BlockfileCursor> *)
                         &(this->m_blockfile_cursors)._M_elems[chain_type].
                          super__Optional_base<node::BlockfileCursor,_true,_true>,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
                         ,0x366,"FindNextBlockPos","m_blockfile_cursors[chain_type]");
    bVar8 = uVar3 == (poVar11->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
                     super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.
                     undo_height;
    iVar10 = 0;
    iVar16 = 0;
    if ((this->m_blockfile_cursors)._M_elems[0].
        super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
      iVar16 = (this->m_blockfile_cursors)._M_elems[0].
               super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
               super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
    }
    if ((this->m_blockfile_cursors)._M_elems[1].
        super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_engaged != false) {
      iVar10 = (this->m_blockfile_cursors)._M_elems[1].
               super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
               super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
    }
    if (iVar10 < iVar16) {
      iVar10 = iVar16;
    }
    _Var19._0_4_ = iVar10 + 1;
    _Var19._M_value.undo_height = 0;
    p_Var1 = &(this->m_blockfile_cursors)._M_elems[chain_type].
              super__Optional_base<node::BlockfileCursor,_true,_true>;
    if ((this->m_blockfile_cursors)._M_elems[chain_type].
        super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_engaged == false) {
      (p_Var1->_M_payload).super__Optional_payload_base<node::BlockfileCursor>._M_engaged = true;
    }
    (p_Var1->_M_payload).super__Optional_payload_base<node::BlockfileCursor>._M_payload = _Var19;
    finalize_undo = bVar8;
    nFile = _Var19._0_4_;
    if ((int)(((long)(this->m_blockfile_info).
                     super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->m_blockfile_info).
                    super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x28) <= (int)_Var19._0_4_) {
      std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::resize
                (this_00,(long)(iVar10 + 2));
    }
  }
  local_a8.nFile = nFile;
  if (nFile != last_blockfile) {
    bVar9 = ::LogAcceptCategory(BLOCKSTORAGE,Debug);
    if (bVar9) {
      CBlockFileInfo::ToString_abi_cxx11_
                ((string *)&new_cursor,
                 (this_00->super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>).
                 _M_impl.super__Vector_impl_data._M_start + last_blockfile);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_00._M_len = 0x65;
      logging_function_00._M_str = "FindNextBlockPos";
      logging_function_00._M_len = 0x10;
      LogPrintFormatInternal<int,std::__cxx11::string,int,unsigned_int>
                (logging_function_00,source_file_00,0x377,BLOCKSTORAGE,Debug,
                 (ConstevalFormatString<4U>)0x68d4f7,&last_blockfile,(string *)&new_cursor,&nFile,
                 &nHeight_local);
      std::__cxx11::string::~string((string *)&new_cursor);
    }
    bVar8 = FlushBlockFile(this,last_blockfile,true,bVar8);
    if ((!bVar8) && (bVar8 = ::LogAcceptCategory(BLOCKSTORAGE,Warning), bVar8)) {
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_01._M_len = 0x65;
      logging_function_01._M_str = "FindNextBlockPos";
      logging_function_01._M_len = 0x10;
      LogPrintFormatInternal<int,bool,int>
                (logging_function_01,source_file_01,899,BLOCKSTORAGE,Warning,
                 (ConstevalFormatString<3U>)0x68d528,&last_blockfile,&finalize_undo,&nFile);
    }
    _Var15._M_value.undo_height = 0;
    _Var15._M_value.file_num = nFile;
    p_Var1 = &(this->m_blockfile_cursors)._M_elems[chain_type].
              super__Optional_base<node::BlockfileCursor,_true,_true>;
    if ((this->m_blockfile_cursors)._M_elems[chain_type].
        super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_engaged == false) {
      (p_Var1->_M_payload).super__Optional_payload_base<node::BlockfileCursor>._M_engaged = true;
    }
    (p_Var1->_M_payload).super__Optional_payload_base<node::BlockfileCursor>._M_payload = _Var15;
    pCVar12 = (this_00->super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>)._M_impl
              .super__Vector_impl_data._M_start;
    lVar14 = (long)nFile;
  }
  CBlockFileInfo::AddBlock(pCVar12 + lVar14,nHeight_local,nTime);
  puVar2 = &(this->m_blockfile_info).
            super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
            super__Vector_impl_data._M_start[nFile].nSize;
  *puVar2 = *puVar2 + nAddSize;
  sVar13 = FlatFileSeq::Allocate(&this->m_block_file_seq,&local_a8,(ulong)nAddSize,&out_of_space);
  if (out_of_space == true) {
    pNVar5 = (this->m_opts).notifications;
    _((bilingual_str *)&new_cursor,(ConstevalStringLiteral)0x68d594);
    (*pNVar5->_vptr_Notifications[8])(pNVar5,&new_cursor);
    bilingual_str::~bilingual_str((bilingual_str *)&new_cursor);
    uVar20 = 0xffffffff;
    uVar17 = 0;
  }
  else {
    if ((sVar13 != 0) && (this->m_prune_mode == true)) {
      this->m_check_for_pruning = true;
    }
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->m_dirty_fileinfo,&nFile);
    uVar17 = (ulong)local_a8.nPos << 0x20;
    uVar20 = (ulong)(uint)local_a8.nFile;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock16.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return (FlatFilePos)(uVar17 | uVar20);
}

Assistant:

FlatFilePos BlockManager::FindNextBlockPos(unsigned int nAddSize, unsigned int nHeight, uint64_t nTime)
{
    LOCK(cs_LastBlockFile);

    const BlockfileType chain_type = BlockfileTypeForHeight(nHeight);

    if (!m_blockfile_cursors[chain_type]) {
        // If a snapshot is loaded during runtime, we may not have initialized this cursor yet.
        assert(chain_type == BlockfileType::ASSUMED);
        const auto new_cursor = BlockfileCursor{this->MaxBlockfileNum() + 1};
        m_blockfile_cursors[chain_type] = new_cursor;
        LogDebug(BCLog::BLOCKSTORAGE, "[%s] initializing blockfile cursor to %s\n", chain_type, new_cursor);
    }
    const int last_blockfile = m_blockfile_cursors[chain_type]->file_num;

    int nFile = last_blockfile;
    if (static_cast<int>(m_blockfile_info.size()) <= nFile) {
        m_blockfile_info.resize(nFile + 1);
    }

    bool finalize_undo = false;
    unsigned int max_blockfile_size{MAX_BLOCKFILE_SIZE};
    // Use smaller blockfiles in test-only -fastprune mode - but avoid
    // the possibility of having a block not fit into the block file.
    if (m_opts.fast_prune) {
        max_blockfile_size = 0x10000; // 64kiB
        if (nAddSize >= max_blockfile_size) {
            // dynamically adjust the blockfile size to be larger than the added size
            max_blockfile_size = nAddSize + 1;
        }
    }
    assert(nAddSize < max_blockfile_size);

    while (m_blockfile_info[nFile].nSize + nAddSize >= max_blockfile_size) {
        // when the undo file is keeping up with the block file, we want to flush it explicitly
        // when it is lagging behind (more blocks arrive than are being connected), we let the
        // undo block write case handle it
        finalize_undo = (static_cast<int>(m_blockfile_info[nFile].nHeightLast) ==
                         Assert(m_blockfile_cursors[chain_type])->undo_height);

        // Try the next unclaimed blockfile number
        nFile = this->MaxBlockfileNum() + 1;
        // Set to increment MaxBlockfileNum() for next iteration
        m_blockfile_cursors[chain_type] = BlockfileCursor{nFile};

        if (static_cast<int>(m_blockfile_info.size()) <= nFile) {
            m_blockfile_info.resize(nFile + 1);
        }
    }
    FlatFilePos pos;
    pos.nFile = nFile;
    pos.nPos = m_blockfile_info[nFile].nSize;

    if (nFile != last_blockfile) {
        LogDebug(BCLog::BLOCKSTORAGE, "Leaving block file %i: %s (onto %i) (height %i)\n",
                 last_blockfile, m_blockfile_info[last_blockfile].ToString(), nFile, nHeight);

        // Do not propagate the return code. The flush concerns a previous block
        // and undo file that has already been written to. If a flush fails
        // here, and we crash, there is no expected additional block data
        // inconsistency arising from the flush failure here. However, the undo
        // data may be inconsistent after a crash if the flush is called during
        // a reindex. A flush error might also leave some of the data files
        // untrimmed.
        if (!FlushBlockFile(last_blockfile, /*fFinalize=*/true, finalize_undo)) {
            LogPrintLevel(BCLog::BLOCKSTORAGE, BCLog::Level::Warning,
                          "Failed to flush previous block file %05i (finalize=1, finalize_undo=%i) before opening new block file %05i\n",
                          last_blockfile, finalize_undo, nFile);
        }
        // No undo data yet in the new file, so reset our undo-height tracking.
        m_blockfile_cursors[chain_type] = BlockfileCursor{nFile};
    }

    m_blockfile_info[nFile].AddBlock(nHeight, nTime);
    m_blockfile_info[nFile].nSize += nAddSize;

    bool out_of_space;
    size_t bytes_allocated = m_block_file_seq.Allocate(pos, nAddSize, out_of_space);
    if (out_of_space) {
        m_opts.notifications.fatalError(_("Disk space is too low!"));
        return {};
    }
    if (bytes_allocated != 0 && IsPruneMode()) {
        m_check_for_pruning = true;
    }

    m_dirty_fileinfo.insert(nFile);
    return pos;
}